

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeForwardPointerDebugType(Builder *this,StorageClass storageClass)

{
  Id IVar1;
  Id IVar2;
  Instruction *this_00;
  mapped_type *this_01;
  Id IVar3;
  Instruction *type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  IVar1 = makeUintConstant(this,storageClass,false);
  addExtension(this,"SPV_KHR_relaxed_extended_instruction");
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  IVar2 = makeVoidType(this);
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
  this_00->resultId = IVar3;
  this_00->typeId = IVar2;
  this_00->opCode = OpExtInstWithForwardRefsKHR;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  type = this_00;
  Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(this_00,3);
  Instruction::addIdOperand(this_00,this_00->resultId);
  Instruction::addIdOperand(this_00,IVar1);
  IVar1 = makeUintConstant(this,0,false);
  Instruction::addIdOperand(this_00,IVar1);
  local_28._M_head_impl._0_4_ = 3;
  this_01 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->groupedDebugTypes,(key_type *)&local_28);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_01,&type);
  local_28._M_head_impl = type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_28);
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,type);
  return type->resultId;
}

Assistant:

Id Builder::makeForwardPointerDebugType(StorageClass storageClass)
{
    const Id scID = makeUintConstant(storageClass);

    this->addExtension(spv::E_SPV_KHR_relaxed_extended_instruction);

    Instruction *type = new Instruction(getUniqueId(), makeVoidType(), OpExtInstWithForwardRefsKHR);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(type->getResultId());
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}